

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx::
     BVHNIntersector1<8,_16777232,_false,_embree::avx::ArrayIntersector1<embree::avx::ObjectIntersector1<true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  undefined4 uVar4;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar5;
  long lVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  byte bVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  AABBNodeMB4D *node1;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  RTCIntersectFunctionN p_Var17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  undefined1 auVar23 [32];
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar25 [32];
  undefined1 auVar24 [16];
  undefined1 auVar26 [64];
  undefined1 extraout_var [56];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [64];
  float fVar32;
  float fVar37;
  float fVar38;
  undefined1 auVar33 [16];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  float fVar39;
  undefined1 auVar36 [64];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [32];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  int mask;
  NodeRef stack [564];
  ulong *local_1358;
  int local_134c;
  ulong local_1348;
  RayQueryContext *local_1340;
  Ray *local_1338;
  long local_1330;
  long local_1328;
  RTCIntersectFunctionNArguments local_1320;
  Geometry *local_12f0;
  undefined8 local_12e8;
  RTCIntersectArguments *local_12e0;
  undefined1 local_12d8 [32];
  undefined1 local_12b8 [32];
  undefined1 local_1298 [32];
  undefined1 local_1278 [32];
  undefined1 local_1258 [32];
  undefined1 local_1238 [32];
  undefined1 local_1218 [32];
  undefined1 local_11f8 [32];
  ulong local_11d8 [565];
  
  local_11d8[0] = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_11d8[0] != 8) {
    fVar3 = ray->tfar;
    if (0.0 <= fVar3) {
      aVar5 = (ray->dir).field_0;
      auVar24 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar33._8_4_ = 0x7fffffff;
      auVar33._0_8_ = 0x7fffffff7fffffff;
      auVar33._12_4_ = 0x7fffffff;
      auVar33 = vandps_avx((undefined1  [16])aVar5,auVar33);
      auVar40._8_4_ = 0x219392ef;
      auVar40._0_8_ = 0x219392ef219392ef;
      auVar40._12_4_ = 0x219392ef;
      auVar33 = vcmpps_avx(auVar33,auVar40,1);
      auVar33 = vblendvps_avx((undefined1  [16])aVar5,auVar40,auVar33);
      local_1358 = local_11d8 + 1;
      auVar40 = vrcpps_avx(auVar33);
      fVar32 = auVar40._0_4_;
      auVar27._0_4_ = fVar32 * auVar33._0_4_;
      fVar37 = auVar40._4_4_;
      auVar27._4_4_ = fVar37 * auVar33._4_4_;
      fVar38 = auVar40._8_4_;
      auVar27._8_4_ = fVar38 * auVar33._8_4_;
      fVar39 = auVar40._12_4_;
      auVar27._12_4_ = fVar39 * auVar33._12_4_;
      auVar41._8_4_ = 0x3f800000;
      auVar41._0_8_ = 0x3f8000003f800000;
      auVar41._12_4_ = 0x3f800000;
      auVar33 = vsubps_avx(auVar41,auVar27);
      uVar4 = *(undefined4 *)&(ray->org).field_0;
      local_11f8._4_4_ = uVar4;
      local_11f8._0_4_ = uVar4;
      local_11f8._8_4_ = uVar4;
      local_11f8._12_4_ = uVar4;
      local_11f8._16_4_ = uVar4;
      local_11f8._20_4_ = uVar4;
      local_11f8._24_4_ = uVar4;
      local_11f8._28_4_ = uVar4;
      auVar45 = ZEXT3264(local_11f8);
      uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      local_1218._4_4_ = uVar4;
      local_1218._0_4_ = uVar4;
      local_1218._8_4_ = uVar4;
      local_1218._12_4_ = uVar4;
      local_1218._16_4_ = uVar4;
      local_1218._20_4_ = uVar4;
      local_1218._24_4_ = uVar4;
      local_1218._28_4_ = uVar4;
      auVar46 = ZEXT3264(local_1218);
      uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      local_1238._4_4_ = uVar4;
      local_1238._0_4_ = uVar4;
      local_1238._8_4_ = uVar4;
      local_1238._12_4_ = uVar4;
      local_1238._16_4_ = uVar4;
      local_1238._20_4_ = uVar4;
      local_1238._24_4_ = uVar4;
      local_1238._28_4_ = uVar4;
      auVar47 = ZEXT3264(local_1238);
      auVar28._0_4_ = fVar32 + fVar32 * auVar33._0_4_;
      auVar28._4_4_ = fVar37 + fVar37 * auVar33._4_4_;
      auVar28._8_4_ = fVar38 + fVar38 * auVar33._8_4_;
      auVar28._12_4_ = fVar39 + fVar39 * auVar33._12_4_;
      auVar33 = vshufps_avx(auVar28,auVar28,0);
      local_1258._16_16_ = auVar33;
      local_1258._0_16_ = auVar33;
      auVar48 = ZEXT3264(local_1258);
      auVar33 = vmovshdup_avx(auVar28);
      auVar36 = ZEXT1664(auVar33);
      auVar40 = vshufps_avx(auVar28,auVar28,0x55);
      local_1278._16_16_ = auVar40;
      local_1278._0_16_ = auVar40;
      auVar49 = ZEXT3264(local_1278);
      auVar40 = vshufpd_avx(auVar28,auVar28,1);
      auVar43 = ZEXT1664(auVar40);
      auVar27 = vshufps_avx(auVar28,auVar28,0xaa);
      auVar31 = ZEXT1664(auVar27);
      local_1298._16_16_ = auVar27;
      local_1298._0_16_ = auVar27;
      auVar50 = ZEXT3264(local_1298);
      uVar19 = (ulong)(auVar28._0_4_ < 0.0) << 5;
      uVar22 = (ulong)(auVar33._0_4_ < 0.0) << 5 | 0x40;
      uVar18 = (ulong)(auVar40._0_4_ < 0.0) << 5 | 0x80;
      uVar21 = uVar19 ^ 0x20;
      auVar33 = vshufps_avx(auVar24,auVar24,0);
      auVar26 = ZEXT1664(auVar33);
      local_12b8._16_16_ = auVar33;
      local_12b8._0_16_ = auVar33;
      auVar44 = ZEXT3264(local_12b8);
      auVar33 = vshufps_avx(ZEXT416((uint)fVar3),ZEXT416((uint)fVar3),0);
      local_12d8._16_16_ = auVar33;
      local_12d8._0_16_ = auVar33;
      auVar51 = ZEXT3264(local_12d8);
      local_1348 = uVar19;
      local_1340 = context;
      local_1338 = ray;
LAB_00e7a73a:
      if (local_1358 != local_11d8) {
        uVar20 = local_1358[-1];
        local_1358 = local_1358 + -1;
LAB_00e7a757:
        fVar3 = (ray->dir).field_0.m128[3];
        auVar23._4_4_ = fVar3;
        auVar23._0_4_ = fVar3;
        auVar23._8_4_ = fVar3;
        auVar23._12_4_ = fVar3;
        auVar23._16_4_ = fVar3;
        auVar23._20_4_ = fVar3;
        auVar23._24_4_ = fVar3;
        auVar23._28_4_ = fVar3;
        while ((uVar20 & 8) == 0) {
          uVar14 = uVar20 & 0xfffffffffffffff0;
          pfVar2 = (float *)(uVar14 + 0x100 + uVar19);
          pfVar1 = (float *)(uVar14 + 0x40 + uVar19);
          auVar25._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar25._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar25._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar25._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          auVar25._16_4_ = fVar3 * pfVar2[4] + pfVar1[4];
          auVar25._20_4_ = fVar3 * pfVar2[5] + pfVar1[5];
          auVar25._24_4_ = fVar3 * pfVar2[6] + pfVar1[6];
          auVar25._28_4_ = auVar26._28_4_ + pfVar1[7];
          auVar25 = vsubps_avx(auVar25,auVar45._0_32_);
          auVar8._4_4_ = auVar48._4_4_ * auVar25._4_4_;
          auVar8._0_4_ = auVar48._0_4_ * auVar25._0_4_;
          auVar8._8_4_ = auVar48._8_4_ * auVar25._8_4_;
          auVar8._12_4_ = auVar48._12_4_ * auVar25._12_4_;
          auVar8._16_4_ = auVar48._16_4_ * auVar25._16_4_;
          auVar8._20_4_ = auVar48._20_4_ * auVar25._20_4_;
          auVar8._24_4_ = auVar48._24_4_ * auVar25._24_4_;
          auVar8._28_4_ = auVar25._28_4_;
          auVar25 = vmaxps_avx(auVar44._0_32_,auVar8);
          pfVar2 = (float *)(uVar14 + 0x100 + uVar22);
          pfVar1 = (float *)(uVar14 + 0x40 + uVar22);
          auVar29._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar29._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar29._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar29._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          auVar29._16_4_ = fVar3 * pfVar2[4] + pfVar1[4];
          auVar29._20_4_ = fVar3 * pfVar2[5] + pfVar1[5];
          auVar29._24_4_ = fVar3 * pfVar2[6] + pfVar1[6];
          auVar29._28_4_ = auVar31._28_4_ + pfVar1[7];
          auVar8 = vsubps_avx(auVar29,auVar46._0_32_);
          auVar7._4_4_ = auVar49._4_4_ * auVar8._4_4_;
          auVar7._0_4_ = auVar49._0_4_ * auVar8._0_4_;
          auVar7._8_4_ = auVar49._8_4_ * auVar8._8_4_;
          auVar7._12_4_ = auVar49._12_4_ * auVar8._12_4_;
          auVar7._16_4_ = auVar49._16_4_ * auVar8._16_4_;
          auVar7._20_4_ = auVar49._20_4_ * auVar8._20_4_;
          auVar7._24_4_ = auVar49._24_4_ * auVar8._24_4_;
          auVar7._28_4_ = auVar8._28_4_;
          pfVar2 = (float *)(uVar14 + 0x100 + uVar18);
          pfVar1 = (float *)(uVar14 + 0x40 + uVar18);
          auVar34._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar34._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar34._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar34._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          auVar34._16_4_ = fVar3 * pfVar2[4] + pfVar1[4];
          auVar34._20_4_ = fVar3 * pfVar2[5] + pfVar1[5];
          auVar34._24_4_ = fVar3 * pfVar2[6] + pfVar1[6];
          auVar34._28_4_ = auVar36._28_4_ + pfVar1[7];
          auVar9 = vsubps_avx(auVar34,auVar47._0_32_);
          auVar11._4_4_ = auVar50._4_4_ * auVar9._4_4_;
          auVar11._0_4_ = auVar50._0_4_ * auVar9._0_4_;
          auVar11._8_4_ = auVar50._8_4_ * auVar9._8_4_;
          auVar11._12_4_ = auVar50._12_4_ * auVar9._12_4_;
          auVar11._16_4_ = auVar50._16_4_ * auVar9._16_4_;
          auVar11._20_4_ = auVar50._20_4_ * auVar9._20_4_;
          auVar11._24_4_ = auVar50._24_4_ * auVar9._24_4_;
          auVar11._28_4_ = auVar9._28_4_;
          auVar8 = vmaxps_avx(auVar7,auVar11);
          auVar25 = vmaxps_avx(auVar25,auVar8);
          pfVar2 = (float *)(uVar14 + 0x100 + uVar21);
          pfVar1 = (float *)(uVar14 + 0x40 + uVar21);
          auVar30._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar30._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar30._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar30._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          auVar30._16_4_ = fVar3 * pfVar2[4] + pfVar1[4];
          auVar30._20_4_ = fVar3 * pfVar2[5] + pfVar1[5];
          auVar30._24_4_ = fVar3 * pfVar2[6] + pfVar1[6];
          auVar30._28_4_ = auVar8._28_4_ + pfVar1[7];
          auVar8 = vsubps_avx(auVar30,auVar45._0_32_);
          auVar12._4_4_ = auVar48._4_4_ * auVar8._4_4_;
          auVar12._0_4_ = auVar48._0_4_ * auVar8._0_4_;
          auVar12._8_4_ = auVar48._8_4_ * auVar8._8_4_;
          auVar12._12_4_ = auVar48._12_4_ * auVar8._12_4_;
          auVar12._16_4_ = auVar48._16_4_ * auVar8._16_4_;
          auVar12._20_4_ = auVar48._20_4_ * auVar8._20_4_;
          auVar12._24_4_ = auVar48._24_4_ * auVar8._24_4_;
          auVar12._28_4_ = auVar8._28_4_;
          pfVar2 = (float *)(uVar14 + 0x100 + (uVar22 ^ 0x20));
          auVar7 = vminps_avx(auVar51._0_32_,auVar12);
          pfVar1 = (float *)(uVar14 + 0x40 + (uVar22 ^ 0x20));
          auVar35._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar35._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar35._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar35._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          auVar35._16_4_ = fVar3 * pfVar2[4] + pfVar1[4];
          auVar35._20_4_ = fVar3 * pfVar2[5] + pfVar1[5];
          auVar35._24_4_ = fVar3 * pfVar2[6] + pfVar1[6];
          auVar35._28_4_ = auVar9._28_4_ + pfVar1[7];
          auVar8 = vsubps_avx(auVar35,auVar46._0_32_);
          pfVar2 = (float *)(uVar14 + 0x100 + (uVar18 ^ 0x20));
          pfVar1 = (float *)(uVar14 + 0x40 + (uVar18 ^ 0x20));
          auVar42._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar42._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar42._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar42._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          auVar42._16_4_ = fVar3 * pfVar2[4] + pfVar1[4];
          auVar42._20_4_ = fVar3 * pfVar2[5] + pfVar1[5];
          auVar42._24_4_ = fVar3 * pfVar2[6] + pfVar1[6];
          auVar42._28_4_ = auVar43._28_4_ + pfVar1[7];
          auVar9._4_4_ = auVar49._4_4_ * auVar8._4_4_;
          auVar9._0_4_ = auVar49._0_4_ * auVar8._0_4_;
          auVar9._8_4_ = auVar49._8_4_ * auVar8._8_4_;
          auVar9._12_4_ = auVar49._12_4_ * auVar8._12_4_;
          auVar9._16_4_ = auVar49._16_4_ * auVar8._16_4_;
          auVar9._20_4_ = auVar49._20_4_ * auVar8._20_4_;
          auVar9._24_4_ = auVar49._24_4_ * auVar8._24_4_;
          auVar9._28_4_ = auVar8._28_4_;
          auVar8 = vsubps_avx(auVar42,auVar47._0_32_);
          auVar13._4_4_ = auVar50._4_4_ * auVar8._4_4_;
          auVar13._0_4_ = auVar50._0_4_ * auVar8._0_4_;
          auVar13._8_4_ = auVar50._8_4_ * auVar8._8_4_;
          auVar13._12_4_ = auVar50._12_4_ * auVar8._12_4_;
          auVar13._16_4_ = auVar50._16_4_ * auVar8._16_4_;
          auVar13._20_4_ = auVar50._20_4_ * auVar8._20_4_;
          auVar13._24_4_ = auVar50._24_4_ * auVar8._24_4_;
          auVar13._28_4_ = auVar8._28_4_;
          auVar43 = ZEXT3264(auVar13);
          auVar8 = vminps_avx(auVar9,auVar13);
          auVar7 = vminps_avx(auVar7,auVar8);
          auVar25 = vcmpps_avx(auVar25,auVar7,2);
          if (((uint)uVar20 & 7) == 6) {
            auVar7 = vcmpps_avx(*(undefined1 (*) [32])(uVar14 + 0x1c0),auVar23,2);
            auVar8 = vcmpps_avx(auVar23,*(undefined1 (*) [32])(uVar14 + 0x1e0),1);
            auVar7 = vandps_avx(auVar7,auVar8);
            auVar25 = vandps_avx(auVar7,auVar25);
          }
          auVar36 = ZEXT3264(auVar8);
          auVar33 = vpackssdw_avx(auVar25._0_16_,auVar25._16_16_);
          auVar24 = vpsllw_avx(auVar33,0xf);
          auVar26 = ZEXT1664(auVar24);
          auVar33 = vpacksswb_avx(auVar24,auVar24);
          auVar31 = ZEXT1664(auVar33);
          bVar10 = SUB161(auVar33 >> 7,0) & 1 | (SUB161(auVar33 >> 0xf,0) & 1) << 1 |
                   (SUB161(auVar33 >> 0x17,0) & 1) << 2 | (SUB161(auVar33 >> 0x1f,0) & 1) << 3 |
                   (SUB161(auVar33 >> 0x27,0) & 1) << 4 | (SUB161(auVar33 >> 0x2f,0) & 1) << 5 |
                   (SUB161(auVar33 >> 0x37,0) & 1) << 6 | SUB161(auVar33 >> 0x3f,0) << 7;
          if ((((((((auVar24 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar24 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar24 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar24 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar24 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar24 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar24 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              -1 < auVar24[0xf]) goto LAB_00e7a73a;
          lVar6 = 0;
          if (bVar10 != 0) {
            for (; (bVar10 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
            }
          }
          uVar20 = *(ulong *)(uVar14 + lVar6 * 8);
          uVar15 = bVar10 - 1 & (uint)bVar10;
          uVar16 = (ulong)uVar15;
          if (uVar15 != 0) goto LAB_00e7a8a7;
        }
        local_1330 = (ulong)((uint)uVar20 & 0xf) - 8;
        for (local_1328 = 0; local_1330 != local_1328; local_1328 = local_1328 + 1) {
          local_1320.geomID = *(uint *)((uVar20 & 0xfffffffffffffff0) + local_1328 * 8);
          local_12f0 = (context->scene->geometries).items[local_1320.geomID].ptr;
          if ((ray->mask & local_12f0->mask) != 0) {
            local_1320.primID = *(uint *)((uVar20 & 0xfffffffffffffff0) + 4 + local_1328 * 8);
            local_134c = -1;
            local_1320.valid = &local_134c;
            local_1320.geometryUserPtr = local_12f0->userPtr;
            local_1320.context = context->user;
            local_1320.N = 1;
            local_12e8 = 0;
            local_12e0 = context->args;
            p_Var17 = local_12e0->intersect;
            if (p_Var17 == (RTCIntersectFunctionN)0x0) {
              p_Var17 = (RTCIntersectFunctionN)
                        local_12f0[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                        _M_i;
            }
            auVar31 = ZEXT1664(auVar31._0_16_);
            auVar36 = ZEXT1664(auVar36._0_16_);
            auVar43 = ZEXT1664(auVar43._0_16_);
            local_1320.rayhit = (RTCRayHitN *)ray;
            (*p_Var17)(&local_1320);
            auVar26._8_56_ = extraout_var;
            auVar26._0_8_ = extraout_XMM1_Qa;
            auVar45 = ZEXT3264(local_11f8);
            auVar46 = ZEXT3264(local_1218);
            auVar47 = ZEXT3264(local_1238);
            auVar48 = ZEXT3264(local_1258);
            auVar49 = ZEXT3264(local_1278);
            auVar50 = ZEXT3264(local_1298);
            auVar44 = ZEXT3264(local_12b8);
            auVar51 = ZEXT3264(local_12d8);
            context = local_1340;
            ray = local_1338;
            uVar19 = local_1348;
            if (local_1338->tfar < 0.0) {
              local_1338->tfar = -INFINITY;
              return;
            }
          }
        }
        goto LAB_00e7a73a;
      }
    }
  }
  return;
LAB_00e7a8a7:
  do {
    *local_1358 = uVar20;
    local_1358 = local_1358 + 1;
    lVar6 = 0;
    if (uVar16 != 0) {
      for (; (uVar16 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
      }
    }
    uVar20 = *(ulong *)(uVar14 + lVar6 * 8);
    uVar16 = uVar16 - 1 & uVar16;
  } while (uVar16 != 0);
  goto LAB_00e7a757;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }